

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrtrns.cpp
# Opt level: O0

UChar * u_strFromJavaModifiedUTF8WithSub_63
                  (UChar *dest,int32_t destCapacity,int32_t *pDestLength,char *src,int32_t srcLength
                  ,UChar32 subchar,int32_t *pNumSubstitutions,UErrorCode *pErrorCode)

{
  byte bVar1;
  int32_t iVar2;
  UBool UVar3;
  size_t sVar4;
  int iVar5;
  UChar *pUVar6;
  bool bVar7;
  byte local_6d;
  int32_t delta;
  int iStack_68;
  uint8_t b;
  int32_t start;
  int32_t count2;
  int32_t count;
  int32_t i;
  uint8_t t2;
  uint uStack_54;
  uint8_t t1;
  UChar32 ch;
  UChar32 c;
  int32_t numSubstitutions;
  int32_t reqLength;
  UChar *pDestLimit;
  UChar *pDest;
  UChar32 subchar_local;
  int32_t srcLength_local;
  char *src_local;
  int32_t *pDestLength_local;
  UChar *pUStack_18;
  int32_t destCapacity_local;
  UChar *dest_local;
  
  pDest._0_4_ = subchar;
  pDest._4_4_ = srcLength;
  _subchar_local = (byte *)src;
  src_local = (char *)pDestLength;
  pDestLength_local._4_4_ = destCapacity;
  pUStack_18 = dest;
  UVar3 = U_FAILURE(*pErrorCode);
  if (UVar3 != '\0') {
    return (UChar *)0x0;
  }
  if ((((_subchar_local == (byte *)0x0) && (pDest._4_4_ != 0)) || (pDest._4_4_ < -1)) ||
     (((pUStack_18 == (UChar *)0x0 && (pDestLength_local._4_4_ != 0)) ||
      ((pDestLength_local._4_4_ < 0 ||
       ((0x10ffff < (int)(uint)pDest || (((uint)pDest & 0xfffff800) == 0xd800)))))))) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (UChar *)0x0;
  }
  if (pNumSubstitutions != (int32_t *)0x0) {
    *pNumSubstitutions = 0;
  }
  pDestLimit = pUStack_18;
  _numSubstitutions = pUStack_18 + pDestLength_local._4_4_;
  c = 0;
  ch = 0;
  if (pDest._4_4_ < 0) {
    while( true ) {
      uStack_54 = (uint)*_subchar_local;
      bVar7 = false;
      if ((uStack_54 != 0) && (bVar7 = false, uStack_54 < 0x80)) {
        bVar7 = pDestLimit < _numSubstitutions;
      }
      if (!bVar7) break;
      *pDestLimit = (ushort)*_subchar_local;
      _subchar_local = _subchar_local + 1;
      pDestLimit = pDestLimit + 1;
    }
    if (uStack_54 == 0) {
      c = (UChar32)((long)pDestLimit - (long)pUStack_18 >> 1);
      if (src_local != (char *)0x0) {
        *(UChar32 *)src_local = c;
      }
      u_terminateUChars_63(pUStack_18,pDestLength_local._4_4_,c,pErrorCode);
      return pUStack_18;
    }
    sVar4 = strlen((char *)_subchar_local);
    pDest._4_4_ = (int32_t)sVar4;
  }
  count2 = 0;
  do {
    iVar2 = count2;
    start = (int32_t)((long)_numSubstitutions - (long)pDestLimit >> 1);
    iStack_68 = pDest._4_4_ - count2;
    if (((iStack_68 <= start) && (0 < pDest._4_4_)) && (((int)(char)*_subchar_local & 0x80U) == 0))
    {
      while( true ) {
        bVar7 = false;
        if (count2 < pDest._4_4_) {
          local_6d = _subchar_local[count2];
          bVar7 = (local_6d & 0x80) == 0;
        }
        if (!bVar7) break;
        *pDestLimit = (ushort)local_6d;
        count2 = count2 + 1;
        pDestLimit = pDestLimit + 1;
      }
      start = start - (count2 - iVar2);
      iStack_68 = iStack_68 - (count2 - iVar2);
    }
    if (0xffff < (int)(uint)pDest) break;
    if (iStack_68 / 3 < start) {
      start = iStack_68 / 3;
    }
    if (start < 3) break;
    do {
      iVar5 = count2 + 1;
      bVar1 = _subchar_local[count2];
      i = (int32_t)bVar1;
      if ((bVar1 & 0x80) == 0) {
        *pDestLimit = (ushort)bVar1;
        count2 = iVar5;
LAB_003ec75f:
        pDestLimit = pDestLimit + 1;
      }
      else if ((uint)i < 0xe0) {
        if (((uint)i < 0xc0) || (count._3_1_ = _subchar_local[iVar5] + 0x80, 0x3f < count._3_1_))
        goto LAB_003ec6e2;
        *pDestLimit = (ushort)((i & 0x1fU) << 6) | (ushort)count._3_1_;
        count2 = count2 + 2;
        pDestLimit = pDestLimit + 1;
      }
      else {
        if (((0xef < (uint)i) || (count._3_1_ = _subchar_local[iVar5] + 0x80, 0x3f < count._3_1_))
           || (count._2_1_ = _subchar_local[count2 + 2] + 0x80, 0x3f < count._2_1_)) {
LAB_003ec6e2:
          if ((int)(uint)pDest < 0) {
            *pErrorCode = U_INVALID_CHAR_FOUND;
            return (UChar *)0x0;
          }
          if (((int)(uint)pDest < 0x10000) || (start = start + -1, start != 0)) {
            count2 = iVar5;
            utf8_nextCharSafeBody_63(_subchar_local,&count2,pDest._4_4_,i,-1);
            ch = ch + 1;
            *pDestLimit = (UChar)(uint)pDest;
            goto LAB_003ec75f;
          }
          break;
        }
        *pDestLimit = (ushort)bVar1 << 0xc | (ushort)count._3_1_ << 6 | (ushort)count._2_1_;
        count2 = count2 + 3;
        pDestLimit = pDestLimit + 1;
      }
      start = start + -1;
    } while (0 < start);
  } while( true );
LAB_003ec77a:
  if (count2 < pDest._4_4_ && pDestLimit < _numSubstitutions) {
    iVar5 = count2 + 1;
    bVar1 = _subchar_local[count2];
    i = (int32_t)bVar1;
    if ((bVar1 & 0x80) == 0) {
      *pDestLimit = (ushort)bVar1;
      count2 = iVar5;
      pDestLimit = pDestLimit + 1;
    }
    else if ((uint)i < 0xe0) {
      if ((((uint)i < 0xc0) || (pDest._4_4_ <= iVar5)) ||
         (count._3_1_ = _subchar_local[iVar5] + 0x80, 0x3f < count._3_1_)) goto LAB_003ec8e1;
      *pDestLimit = (ushort)((i & 0x1fU) << 6) | (ushort)count._3_1_;
      count2 = count2 + 2;
      pDestLimit = pDestLimit + 1;
    }
    else if ((((uint)i < 0xf0) && (count2 + 2 < pDest._4_4_)) &&
            ((count._3_1_ = _subchar_local[iVar5] + 0x80, count._3_1_ < 0x40 &&
             (count._2_1_ = _subchar_local[count2 + 2] + 0x80, count._2_1_ < 0x40)))) {
      *pDestLimit = (ushort)bVar1 << 0xc | (ushort)count._3_1_ << 6 | (ushort)count._2_1_;
      count2 = count2 + 3;
      pDestLimit = pDestLimit + 1;
    }
    else {
LAB_003ec8e1:
      if ((int)(uint)pDest < 0) {
        *pErrorCode = U_INVALID_CHAR_FOUND;
        return (UChar *)0x0;
      }
      count2 = iVar5;
      utf8_nextCharSafeBody_63(_subchar_local,&count2,pDest._4_4_,i,-1);
      ch = ch + 1;
      if ((int)(uint)pDest < 0x10000) {
        *pDestLimit = (UChar)(uint)pDest;
        pDestLimit = pDestLimit + 1;
      }
      else {
        pUVar6 = pDestLimit + 1;
        *pDestLimit = (short)((int)(uint)pDest >> 10) + L'ퟀ';
        if (_numSubstitutions <= pUVar6) {
          c = c + 1;
          pDestLimit = pUVar6;
          goto LAB_003ec9a9;
        }
        pDestLimit = pDestLimit + 2;
        *pUVar6 = (UChar)(uint)pDest & 0x3ffU | 0xdc00;
      }
    }
    goto LAB_003ec77a;
  }
LAB_003ec9a9:
  do {
    while( true ) {
      if (pDest._4_4_ <= count2) {
        if (pNumSubstitutions != (int32_t *)0x0) {
          *pNumSubstitutions = ch;
        }
        c = (int)((long)pDestLimit - (long)pUStack_18 >> 1) + c;
        if (src_local != (char *)0x0) {
          *(UChar32 *)src_local = c;
        }
        u_terminateUChars_63(pUStack_18,pDestLength_local._4_4_,c,pErrorCode);
        return pUStack_18;
      }
      iVar5 = count2 + 1;
      i = (int32_t)_subchar_local[count2];
      if ((_subchar_local[count2] & 0x80) != 0) break;
      c = c + 1;
      count2 = iVar5;
    }
    if (0xdf < (uint)i) {
      if ((((uint)i < 0xf0) && (count2 + 2 < pDest._4_4_)) &&
         (((byte)(_subchar_local[iVar5] + 0x80) < 0x40 &&
          ((byte)(_subchar_local[count2 + 2] + 0x80) < 0x40)))) {
        c = c + 1;
        count2 = count2 + 3;
      }
      else {
LAB_003eca99:
        if ((int)(uint)pDest < 0) {
          *pErrorCode = U_INVALID_CHAR_FOUND;
          return (UChar *)0x0;
        }
        count2 = iVar5;
        utf8_nextCharSafeBody_63(_subchar_local,&count2,pDest._4_4_,i,-1);
        ch = ch + 1;
        iVar5 = 2;
        if ((uint)i < 0x10000) {
          iVar5 = 1;
        }
        c = iVar5 + c;
      }
      goto LAB_003ec9a9;
    }
    if ((((uint)i < 0xc0) || (pDest._4_4_ <= iVar5)) ||
       (0x3f < (byte)(_subchar_local[iVar5] + 0x80))) goto LAB_003eca99;
    c = c + 1;
    count2 = count2 + 2;
  } while( true );
}

Assistant:

U_CAPI UChar* U_EXPORT2
u_strFromJavaModifiedUTF8WithSub(
        UChar *dest,
        int32_t destCapacity,
        int32_t *pDestLength,
        const char *src,
        int32_t srcLength,
        UChar32 subchar, int32_t *pNumSubstitutions,
        UErrorCode *pErrorCode) {
    /* args check */
    if(U_FAILURE(*pErrorCode)) {
        return NULL;
    }
    if( (src==NULL && srcLength!=0) || srcLength < -1 ||
        (dest==NULL && destCapacity!=0) || destCapacity<0 ||
        subchar > 0x10ffff || U_IS_SURROGATE(subchar)
    ) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=0;
    }
    UChar *pDest = dest;
    UChar *pDestLimit = dest+destCapacity;
    int32_t reqLength = 0;
    int32_t numSubstitutions=0;

    if(srcLength < 0) {
        /*
         * Transform a NUL-terminated ASCII string.
         * Handle non-ASCII strings with slower code.
         */
        UChar32 c;
        while(((c = (uint8_t)*src) != 0) && c <= 0x7f && (pDest < pDestLimit)) {
            *pDest++=(UChar)c;
            ++src;
        }
        if(c == 0) {
            reqLength=(int32_t)(pDest - dest);
            if(pDestLength) {
                *pDestLength = reqLength;
            }

            /* Terminate the buffer */
            u_terminateUChars(dest, destCapacity, reqLength, pErrorCode);
            return dest;
        }
        srcLength = static_cast<int32_t>(uprv_strlen(src));
    }

    /* Faster loop without ongoing checking for srcLength and pDestLimit. */
    UChar32 ch;
    uint8_t t1, t2;
    int32_t i = 0;
    for(;;) {
        int32_t count = (int32_t)(pDestLimit - pDest);
        int32_t count2 = srcLength - i;
        if(count >= count2 && srcLength > 0 && U8_IS_SINGLE(*src)) {
            /* fast ASCII loop */
            int32_t start = i;
            uint8_t b;
            while(i < srcLength && U8_IS_SINGLE(b = src[i])) {
                *pDest++=b;
                ++i;
            }
            int32_t delta = i - start;
            count -= delta;
            count2 -= delta;
        }
        /*
         * Each iteration of the inner loop progresses by at most 3 UTF-8
         * bytes and one UChar.
         */
        if(subchar > 0xFFFF) {
            break;
        }
        count2 /= 3;
        if(count > count2) {
            count = count2; /* min(remaining dest, remaining src/3) */
        }
        if(count < 3) {
            /*
             * Too much overhead if we get near the end of the string,
             * continue with the next loop.
             */
            break;
        }
        do {
            ch = (uint8_t)src[i++];
            if(U8_IS_SINGLE(ch)) {
                *pDest++=(UChar)ch;
            } else {
                if(ch >= 0xe0) {
                    if( /* handle U+0000..U+FFFF inline */
                        ch <= 0xef &&
                        (t1 = (uint8_t)(src[i] - 0x80)) <= 0x3f &&
                        (t2 = (uint8_t)(src[i+1] - 0x80)) <= 0x3f
                    ) {
                        /* no need for (ch & 0xf) because the upper bits are truncated after <<12 in the cast to (UChar) */
                        *pDest++ = (UChar)((ch << 12) | (t1 << 6) | t2);
                        i += 2;
                        continue;
                    }
                } else {
                    if( /* handle U+0000..U+07FF inline */
                        ch >= 0xc0 &&
                        (t1 = (uint8_t)(src[i] - 0x80)) <= 0x3f
                    ) {
                        *pDest++ = (UChar)(((ch & 0x1f) << 6) | t1);
                        ++i;
                        continue;
                    }
                }

                if(subchar < 0) {
                    *pErrorCode = U_INVALID_CHAR_FOUND;
                    return NULL;
                } else if(subchar > 0xffff && --count == 0) {
                    /*
                     * We need to write two UChars, adjusted count for that,
                     * and ran out of space.
                     */
                    --i;  // back out byte ch
                    break;
                } else {
                    /* function call for error cases */
                    utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, ch, -1);
                    ++numSubstitutions;
                    *(pDest++)=(UChar)subchar;
                }
            }
        } while(--count > 0);
    }

    while(i < srcLength && (pDest < pDestLimit)) {
        ch = (uint8_t)src[i++];
        if(U8_IS_SINGLE(ch)){
            *pDest++=(UChar)ch;
        } else {
            if(ch >= 0xe0) {
                if( /* handle U+0000..U+FFFF inline */
                    ch <= 0xef &&
                    (i+1) < srcLength &&
                    (t1 = (uint8_t)(src[i] - 0x80)) <= 0x3f &&
                    (t2 = (uint8_t)(src[i+1] - 0x80)) <= 0x3f
                ) {
                    /* no need for (ch & 0xf) because the upper bits are truncated after <<12 in the cast to (UChar) */
                    *pDest++ = (UChar)((ch << 12) | (t1 << 6) | t2);
                    i += 2;
                    continue;
                }
            } else {
                if( /* handle U+0000..U+07FF inline */
                    ch >= 0xc0 &&
                    i < srcLength &&
                    (t1 = (uint8_t)(src[i] - 0x80)) <= 0x3f
                ) {
                    *pDest++ = (UChar)(((ch & 0x1f) << 6) | t1);
                    ++i;
                    continue;
                }
            }

            if(subchar < 0) {
                *pErrorCode = U_INVALID_CHAR_FOUND;
                return NULL;
            } else {
                /* function call for error cases */
                utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, ch, -1);
                ++numSubstitutions;
                if(subchar<=0xFFFF) {
                    *(pDest++)=(UChar)subchar;
                } else {
                    *(pDest++)=U16_LEAD(subchar);
                    if(pDest<pDestLimit) {
                        *(pDest++)=U16_TRAIL(subchar);
                    } else {
                        reqLength++;
                        break;
                    }
                }
            }
        }
    }

    /* Pre-flight the rest of the string. */
    while(i < srcLength) {
        ch = (uint8_t)src[i++];
        if(U8_IS_SINGLE(ch)) {
            reqLength++;
        } else {
            if(ch >= 0xe0) {
                if( /* handle U+0000..U+FFFF inline */
                    ch <= 0xef &&
                    (i+1) < srcLength &&
                    (uint8_t)(src[i] - 0x80) <= 0x3f &&
                    (uint8_t)(src[i+1] - 0x80) <= 0x3f
                ) {
                    reqLength++;
                    i += 2;
                    continue;
                }
            } else {
                if( /* handle U+0000..U+07FF inline */
                    ch >= 0xc0 &&
                    i < srcLength &&
                    (uint8_t)(src[i] - 0x80) <= 0x3f
                ) {
                    reqLength++;
                    ++i;
                    continue;
                }
            }

            if(subchar < 0) {
                *pErrorCode = U_INVALID_CHAR_FOUND;
                return NULL;
            } else {
                /* function call for error cases */
                utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, ch, -1);
                ++numSubstitutions;
                reqLength+=U16_LENGTH(ch);
            }
        }
    }

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=numSubstitutions;
    }

    reqLength+=(int32_t)(pDest - dest);
    if(pDestLength) {
        *pDestLength = reqLength;
    }

    /* Terminate the buffer */
    u_terminateUChars(dest, destCapacity, reqLength, pErrorCode);
    return dest;
}